

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int lnsrchmod(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
             int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  bool bVar1;
  int iVar2;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_148;
  double funchi;
  double funclo;
  double lambdadiff;
  double lambdainc;
  double lambdalo;
  double lambdamax;
  double beta;
  double *slopen;
  double *pl;
  double *rcheck;
  double *ab;
  double *temp2;
  double *temp1;
  double *slopei;
  double nlen;
  double rell;
  double den;
  double ll;
  double lambdaprev2;
  double lambda2;
  double funcprev;
  double lambdatemp;
  double lambdaprev;
  double funci;
  double funcf;
  double lambdamin;
  double lambda;
  double alpha;
  int local_60;
  int gfdcode;
  int i;
  int retval;
  double stol_local;
  double eps2_local;
  double maxstep_local;
  int N_local;
  double *p_local;
  double *jac_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N << 3);
  B_00 = (double *)malloc((long)N << 3);
  gfdcode = 100;
  lambdamin = 1.0;
  slopei = (double *)0x0;
  lambda2 = 1.0;
  lambdatemp = 1.0;
  for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
    slopei = (double *)(dx[local_60] * p[local_60] * dx[local_60] * p[local_60] + (double)slopei);
  }
  slopei = (double *)sqrt((double)slopei);
  if (maxstep < (double)slopei) {
    scale(p,1,N,maxstep / (double)slopei);
    slopei = (double *)maxstep;
  }
  mmult(jac,p,C,1,N,1);
  for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
    if (ABS(xi[local_60]) <= 1.0 / ABS(dx[local_60])) {
      rell = 1.0 / ABS(dx[local_60]);
    }
    else {
      rell = ABS(xi[local_60]);
    }
    array[local_60] = p[local_60] / rell;
  }
  dVar3 = array_max_abs(array,N);
  dVar4 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    free(C);
    free(A);
    free(B);
    free(C_01);
    free(array);
    free(B_00);
    free(C_00);
    funcpt_local._4_4_ = 0xf;
  }
  else if (NAN(dVar4)) {
    printf("Program Exiting as the function returns NaN");
    free(C);
    free(A);
    free(B);
    free(C_01);
    free(array);
    free(B_00);
    free(C_00);
    funcpt_local._4_4_ = 0xf;
  }
  else {
    while (1 < gfdcode) {
      for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
        B_00[local_60] = p[local_60] * lambdamin;
      }
      madd(xi,B_00,x,1,N);
      funci = (*funcpt->funcpt)(x,N,funcpt->params);
      if ((1.79769313486232e+308 <= funci) || (funci <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        free(C);
        free(A);
        free(B);
        free(C_01);
        free(array);
        free(B_00);
        free(C_00);
        return 0xf;
      }
      if (NAN(funci)) {
        printf("Program Exiting as the function returns NaN");
        free(C);
        free(A);
        free(B);
        free(C_01);
        free(array);
        free(B_00);
        free(C_00);
        return 0xf;
      }
      if (lambdamin * 0.0001 * *C + dVar4 < funci) {
        if (stol / dVar3 <= lambdamin) {
          if ((lambdamin != 1.0) || (NAN(lambdamin))) {
            *A = 1.0 / (lambdamin * lambdamin);
            A[1] = -1.0 / (lambdatemp * lambdatemp);
            A[2] = -lambdatemp / (lambdamin * lambdamin);
            A[3] = lambdamin / (lambdatemp * lambdatemp);
            *B = -lambdamin * *C + (funci - dVar4);
            B[1] = -lambdatemp * *C + (lambda2 - dVar4);
            mmult(A,B,C_01,2,2,1);
            scale(C_01,1,2,1.0 / (lambdamin - lambdatemp));
            if ((*C_01 != 0.0) || (NAN(*C_01))) {
              dVar5 = C_01[1];
              dVar6 = sqrt(C_01[1] * C_01[1] + -(*C_01 * 3.0 * *C));
              funcprev = (-dVar5 + dVar6) / (*C_01 * 3.0);
            }
            else {
              funcprev = -*C / (C_01[1] * 2.0);
            }
            if (lambdamin * 0.5 < funcprev) {
              funcprev = lambdamin * 0.5;
            }
          }
          else {
            funcprev = -*C / (((funci - dVar4) - *C) * 2.0);
          }
          lambdatemp = lambdamin;
          lambda2 = funci;
          if (lambdamin * 0.1 < funcprev) {
            lambdamin = funcprev;
          }
          else {
            lambdamin = lambdamin * 0.1;
          }
        }
        else {
          gfdcode = 1;
          for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
            x[local_60] = xi[local_60];
          }
        }
      }
      else {
        iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
        if (iVar2 == 0xf) {
          return 0xf;
        }
        mmult(jacf,p,C_00,1,N,1);
        if (*C_00 < *C * 0.4) {
          if (((lambdamin == 1.0) && (!NAN(lambdamin))) && ((double)slopei < maxstep)) {
            dVar5 = maxstep / (double)slopei;
            while( true ) {
              bVar1 = false;
              if ((funci <= lambdamin * 0.0001 * *C + dVar4) && (bVar1 = false, *C_00 < *C * 0.4)) {
                bVar1 = lambdamin < dVar5;
              }
              if (!bVar1) break;
              lambdatemp = lambdamin;
              lambda2 = funci;
              dVar6 = dVar5;
              if (lambdamin * 2.0 < dVar5) {
                dVar6 = lambdamin * 2.0;
              }
              lambdamin = dVar6;
              for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
                B_00[local_60] = p[local_60] * lambdamin;
              }
              madd(xi,B_00,x,1,N);
              funci = (*funcpt->funcpt)(x,N,funcpt->params);
              if ((1.79769313486232e+308 <= funci) || (funci <= -1.79769313486232e+308)) {
                printf("Program Exiting as the function value exceeds the maximum double value");
                free(C);
                free(A);
                free(B);
                free(C_01);
                free(array);
                free(B_00);
                free(C_00);
                return 0xf;
              }
              if (NAN(funci)) {
                printf("Program Exiting as the function returns NaN");
                free(C);
                free(A);
                free(B);
                free(C_01);
                free(array);
                free(B_00);
                free(C_00);
                return 0xf;
              }
              if (funci <= lambdamin * 0.0001 * *C + dVar4) {
                iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                if (iVar2 == 0xf) {
                  free(C);
                  free(A);
                  free(B);
                  free(C_01);
                  free(array);
                  free(B_00);
                  free(C_00);
                  return 0xf;
                }
                mmult(jacf,p,C_00,1,N,1);
              }
            }
          }
          if ((lambdamin < 1.0) || ((1.0 < lambdamin && (lambdamin * 0.0001 * *C + dVar4 < funci))))
          {
            if (lambdatemp <= lambdamin) {
              lambdainc = lambdatemp;
            }
            else {
              lambdainc = lambdamin;
            }
            funclo = ABS(lambdatemp - lambdamin);
            if (lambdatemp <= lambdamin) {
              local_148 = funci;
              funchi = lambda2;
            }
            else {
              funchi = funci;
              local_148 = lambda2;
            }
            while (*C_00 < *C * 0.4 && stol / dVar3 <= funclo) {
              lambdadiff = (-*C_00 * funclo * funclo) /
                           ((local_148 - (*C_00 * funclo + funchi)) * 2.0);
              if (lambdadiff < funclo * 0.2) {
                lambdadiff = funclo * 0.2;
              }
              lambdamin = lambdainc + lambdadiff;
              for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
                B_00[local_60] = p[local_60] * lambdamin;
              }
              madd(xi,B_00,x,1,N);
              dVar5 = (*funcpt->funcpt)(x,N,funcpt->params);
              if ((1.79769313486232e+308 <= dVar5) || (dVar5 <= -1.79769313486232e+308)) {
                printf("Program Exiting as the function value exceeds the maximum double value");
                free(C);
                free(A);
                free(B);
                free(C_01);
                free(array);
                free(B_00);
                free(C_00);
                return 0xf;
              }
              if (NAN(dVar5)) {
                printf("Program Exiting as the function returns NaN");
                free(C);
                free(A);
                free(B);
                free(C_01);
                free(array);
                free(B_00);
                free(C_00);
                return 0xf;
              }
              if (dVar5 <= lambdamin * 0.0001 * *C + dVar4) {
                iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                if (iVar2 == 0xf) {
                  free(C);
                  free(A);
                  free(B);
                  free(C_01);
                  free(array);
                  free(B_00);
                  free(C_00);
                  return 0xf;
                }
                mmult(jacf,p,C_00,1,N,1);
                if (*C_00 < *C * 0.4) {
                  funclo = funclo - lambdadiff;
                  funchi = dVar5;
                  lambdainc = lambdamin;
                }
              }
              else {
                funclo = lambdadiff;
                local_148 = dVar5;
              }
            }
            if (*C_00 < *C * 0.4) {
              gfdcode = -5;
              for (local_60 = 0; local_60 < N; local_60 = local_60 + 1) {
                B_00[local_60] = p[local_60] * lambdainc;
              }
              madd(xi,B_00,x,1,N);
            }
          }
        }
        if (gfdcode != -5) {
          gfdcode = 0;
        }
      }
    }
    if (gfdcode == -5) {
      gfdcode = 5;
    }
    free(C);
    free(A);
    free(B);
    free(C_01);
    free(array);
    free(B_00);
    free(C_00);
    funcpt_local._4_4_ = gfdcode;
  }
  return funcpt_local._4_4_;
}

Assistant:

int lnsrchmod(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
		double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.4;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	//mdisplay(p,1,N);
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		//printf("%g lmax %g %g \n",lambda,funcf,funci + alpha *lambda *slopei[0]);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			
			if(slopen[0] < beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						
						while (funcf <= funci + alpha *lambda *slopei[0] && slopen[0] < beta * slopei[0] && lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
						
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}

						while ((slopen[0] < beta * slopei[0]) && lambdadiff >= lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (slopen[0] < beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (slopen[0] < beta * slopei[0]) {
							retval = -5;
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			if (retval != -5) {
				retval = 0;
			}
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	if (retval == -5) {
		retval = 5;
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}